

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraKateGenerator::CreateDummyKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  string *psVar1;
  ostream *poVar2;
  string filename;
  cmGeneratedFileStream fout;
  string sStack_2c8;
  cmAlphaNum local_2a8;
  undefined1 local_278 [32];
  byte abStack_258 [584];
  
  psVar1 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  local_278._8_8_ = (psVar1->_M_dataplus)._M_p;
  local_278._0_8_ = psVar1->_M_string_length;
  local_2a8.View_._M_str = local_2a8.Digits_;
  local_2a8.View_._M_len = 1;
  local_2a8.Digits_[0] = '/';
  cmStrCat<std::__cxx11::string,char[13]>
            (&sStack_2c8,(cmAlphaNum *)local_278,&local_2a8,&this->ProjectName,
             (char (*) [13])0x5ea7b5);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,&sStack_2c8,false,None);
  if ((abStack_258[(long)*(_func_int **)(local_278._0_8_ + -0x18)] & 5) == 0) {
    poVar2 = std::operator<<((ostream *)local_278,"#Generated by ");
    psVar1 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)psVar1);
    std::operator<<(poVar2,", do not edit.\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  std::__cxx11::string::~string((string *)&sStack_2c8);
  return;
}

Assistant:

void cmExtraKateGenerator::CreateDummyKateProjectFile(
  const cmLocalGenerator& lg) const
{
  std::string filename =
    cmStrCat(lg.GetBinaryDirectory(), '/', this->ProjectName, ".kateproject");
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  fout << "#Generated by " << cmSystemTools::GetCMakeCommand()
       << ", do not edit.\n";
}